

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Display.cpp
# Opt level: O0

void sf::priv::CloseDisplay(Display *display)

{
  Lock local_18;
  Lock lock;
  Display *display_local;
  
  lock.m_mutex = (Mutex *)display;
  Lock::Lock(&local_18,(Mutex *)&(anonymous_namespace)::mutex);
  if (lock.m_mutex == (anonymous_namespace)::sharedDisplay) {
    (anonymous_namespace)::referenceCount = (anonymous_namespace)::referenceCount + -1;
    if ((anonymous_namespace)::referenceCount == 0) {
      XCloseDisplay(lock.m_mutex);
    }
    Lock::~Lock(&local_18);
    return;
  }
  __assert_fail("display == sharedDisplay",
                "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/sfml-src/src/SFML/Window/Unix/Display.cpp"
                ,0x51,"void sf::priv::CloseDisplay(Display *)");
}

Assistant:

void CloseDisplay(Display* display)
{
    Lock lock(mutex);

    assert(display == sharedDisplay);

    referenceCount--;
    if (referenceCount == 0)
        XCloseDisplay(display);
}